

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoundFunction.cpp
# Opt level: O0

void __thiscall
Js::BoundFunction::BoundFunction(BoundFunction *this,Arguments *args,DynamicType *type)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  Var pvVar5;
  RecyclableObject *pRVar6;
  RecyclableObject **ppRVar7;
  RecyclableObject *pRVar8;
  DynamicTypeHandler *pDVar9;
  Recycler *pRVar10;
  WriteBarrierPtr<void> *ptr;
  WriteBarrierPtr<void> **ppWVar11;
  JavascriptLibrary *this_00;
  int *piVar12;
  int local_90;
  uint local_8c;
  code *pcStack_88;
  uint i;
  undefined8 local_80;
  TrackAllocData local_78;
  undefined4 local_4c;
  Var pvStack_48;
  uint countAccountedFor;
  Var varLength;
  RecyclableObject *pRStack_38;
  int len;
  RecyclableObject *proto;
  ScriptContext *scriptContext;
  DynamicType *local_20;
  DynamicType *type_local;
  Arguments *args_local;
  BoundFunction *this_local;
  
  local_20 = type;
  type_local = (DynamicType *)args;
  args_local = (Arguments *)this;
  JavascriptFunction::JavascriptFunction
            (&this->super_JavascriptFunction,type,(FunctionInfo *)functionInfo);
  (this->super_JavascriptFunction).super_DynamicObject.super_RecyclableObject.
  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_01dfc258;
  Memory::WriteBarrierPtr<Js::RecyclableObject>::WriteBarrierPtr(&this->targetFunction);
  Memory::WriteBarrierPtr<void>::WriteBarrierPtr(&this->boundThis);
  this->count = 0;
  scriptContext = (ScriptContext *)0x0;
  Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<void>_>::WriteBarrierPtr
            (&this->boundArgs,&scriptContext);
  JavascriptFunction::VerifyEntryPoint(&this->super_JavascriptFunction);
  if (((ulong)args->Info & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/BoundFunction.cpp"
                                ,0x1c,"(args.Info.Count > 0)",
                                "wrong number of args in BoundFunction");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  proto = (RecyclableObject *)RecyclableObject::GetScriptContext((RecyclableObject *)this);
  pvVar5 = Arguments::operator[](args,0);
  pRVar6 = VarTo<Js::RecyclableObject>(pvVar5);
  Memory::WriteBarrierPtr<Js::RecyclableObject>::operator=(&this->targetFunction,pRVar6);
  ppRVar7 = Memory::WriteBarrierPtr::operator_cast_to_RecyclableObject__
                      ((WriteBarrierPtr *)&this->targetFunction);
  BVar3 = CrossSite::NeedMarshalVar(*ppRVar7,(ScriptContext *)proto);
  if (BVar3 != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/BoundFunction.cpp"
                                ,0x21,"(!CrossSite::NeedMarshalVar(targetFunction, scriptContext))",
                                "!CrossSite::NeedMarshalVar(targetFunction, scriptContext)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  ppRVar7 = Memory::WriteBarrierPtr::operator_cast_to_RecyclableObject__
                      ((WriteBarrierPtr *)&this->targetFunction);
  pRVar6 = Js::JavascriptOperators::GetPrototype(*ppRVar7);
  pRStack_38 = pRVar6;
  pRVar8 = Js::Type::GetPrototype(&local_20->super_Type);
  if (pRVar6 != pRVar8) {
    bVar2 = DynamicType::GetIsShared(local_20);
    if (bVar2) {
      DynamicObject::ChangeType((DynamicObject *)this);
      local_20 = DynamicObject::GetDynamicType((DynamicObject *)this);
    }
    DynamicType::SetPrototype(local_20,pRStack_38);
  }
  varLength._4_4_ = 0;
  ppRVar7 = Memory::WriteBarrierPtr::operator_cast_to_RecyclableObject__
                      ((WriteBarrierPtr *)&this->targetFunction);
  BVar3 = Js::JavascriptOperators::HasOwnProperty
                    (*ppRVar7,0xd1,(ScriptContext *)proto,(PropertyString *)0x0);
  if (BVar3 == 1) {
    pRVar6 = Memory::WriteBarrierPtr<Js::RecyclableObject>::operator->(&this->targetFunction);
    ppRVar7 = Memory::WriteBarrierPtr::operator_cast_to_RecyclableObject__
                        ((WriteBarrierPtr *)&this->targetFunction);
    BVar3 = RecyclableObject::GetProperty
                      (pRVar6,*ppRVar7,0xd1,&stack0xffffffffffffffb8,(PropertyValueInfo *)0x0,
                       (ScriptContext *)proto);
    if (BVar3 != 0) {
      varLength._4_4_ = JavascriptConversion::ToInt32(pvStack_48,(ScriptContext *)proto);
    }
  }
  pDVar9 = DynamicObject::GetTypeHandler((DynamicObject *)this);
  (*pDVar9->_vptr_DynamicTypeHandler[0x10])(pDVar9,this);
  if ((SUB84(args->Info,0) & 0xffffff) == 1 || ((ulong)args->Info & 0xffffff) == 0) {
    this_00 = ScriptContext::GetLibrary((ScriptContext *)proto);
    pRVar6 = JavascriptLibraryBase::GetUndefined(&this_00->super_JavascriptLibraryBase);
    Memory::WriteBarrierPtr<void>::operator=(&this->boundThis,pRVar6);
  }
  else {
    pvVar5 = Arguments::operator[](args,1);
    Memory::WriteBarrierPtr<void>::operator=(&this->boundThis,pvVar5);
    local_4c = 2;
    this->count = (SUB84(args->Info,0) & 0xffffff) - 2;
    if (2 < (SUB84(args->Info,0) & 0xffffff)) {
      pRVar10 = ScriptContext::GetRecycler((ScriptContext *)proto);
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_78,(type_info *)&Memory::WriteBarrierPtr<void>::typeinfo,0,
                 (ulong)this->count,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/BoundFunction.cpp"
                 ,0x47);
      pRVar10 = Memory::Recycler::TrackAllocInfo(pRVar10,&local_78);
      pcStack_88 = Memory::Recycler::Alloc;
      local_80 = 0;
      ptr = Memory::AllocateArray<Memory::Recycler,Memory::WriteBarrierPtr<void>,false>
                      ((Memory *)pRVar10,(Recycler *)Memory::Recycler::Alloc,0,(ulong)this->count);
      Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<void>_>::operator=(&this->boundArgs,ptr);
      for (local_8c = 0; local_8c < this->count; local_8c = local_8c + 1) {
        pvVar5 = Arguments::operator[](args,local_8c + 2);
        ppWVar11 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                             ((WriteBarrierPtr *)&this->boundArgs);
        Memory::WriteBarrierPtr<void>::operator=(*ppWVar11 + local_8c,pvVar5);
      }
    }
  }
  varLength._4_4_ = varLength._4_4_ - this->count;
  local_90 = 0;
  piVar12 = max<int>((int *)((long)&varLength + 4),&local_90);
  varLength._4_4_ = *piVar12;
  pvVar5 = TaggedInt::ToVarUnchecked(varLength._4_4_);
  (*(this->super_JavascriptFunction).super_DynamicObject.super_RecyclableObject.
    super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (this,0xd1,pvVar5,2,0,0,0);
  return;
}

Assistant:

BoundFunction::BoundFunction(Arguments args, DynamicType * type)
        : JavascriptFunction(type, &functionInfo),
        count(0),
        boundArgs(nullptr)
    {
        DebugOnly(VerifyEntryPoint());
        AssertMsg(args.Info.Count > 0, "wrong number of args in BoundFunction");

        ScriptContext *scriptContext = this->GetScriptContext();
        targetFunction = VarTo<RecyclableObject>(args[0]);

        Assert(!CrossSite::NeedMarshalVar(targetFunction, scriptContext));

        // Let proto be targetFunction.[[GetPrototypeOf]]().
        RecyclableObject* proto = JavascriptOperators::GetPrototype(targetFunction);
        if (proto != type->GetPrototype())
        {
            if (type->GetIsShared())
            {
                this->ChangeType();
                type = this->GetDynamicType();
            }
            type->SetPrototype(proto);
        }

        int len = 0;
        // If targetFunction is proxy, need to make sure that traps are called in right order as per 19.2.3.2 in RC#4 dated April 3rd 2015.
        // additionally need to get the correct length value for the boundFunctions' length property
        if (JavascriptOperators::HasOwnProperty(targetFunction, PropertyIds::length, scriptContext, nullptr) == TRUE)
        {
            Var varLength;
            if (targetFunction->GetProperty(targetFunction, PropertyIds::length, &varLength, nullptr, scriptContext))
            {
                len = JavascriptConversion::ToInt32(varLength, scriptContext);
            }
        }
        GetTypeHandler()->EnsureObjectReady(this);

        if (args.Info.Count > 1)
        {
            boundThis = args[1];

            // function object and "this" arg
            const uint countAccountedFor = 2;
            count = args.Info.Count - countAccountedFor;

            // Store the args excluding function obj and "this" arg
            if (args.Info.Count > 2)
            {
                boundArgs = RecyclerNewArray(scriptContext->GetRecycler(), Field(Var), count);

                for (uint i=0; i<count; i++)
                {
                    boundArgs[i] = args[i+countAccountedFor];
                }
            }
        }
        else
        {
            // If no "this" is passed, "undefined" is used
            boundThis = scriptContext->GetLibrary()->GetUndefined();
        }

        // Reduce length number of bound args
        len = len - this->count;
        len = max(len, 0);

        SetPropertyWithAttributes(PropertyIds::length, TaggedInt::ToVarUnchecked(len), PropertyConfigurable, nullptr, PropertyOperation_None, SideEffects_None);
    }